

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O0

void __thiscall
XPMP2::RemoteAcDetailTy::RemoteAcDetailTy
          (RemoteAcDetailTy *this,Aircraft *_ac,double _lat,double _lon,float _alt_ft,
          uint16_t _dTime)

{
  void *in_RDI;
  uint16_t in_stack_000000f2;
  float in_stack_000000f4;
  double in_stack_000000f8;
  double in_stack_00000100;
  Aircraft *in_stack_00000108;
  RemoteAcDetailTy *in_stack_00000110;
  
  memset(in_RDI,0,0x120);
  *(undefined8 *)((long)in_RDI + 0x48) = 0;
  *(undefined8 *)((long)in_RDI + 0x40) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  CopyFrom(in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_000000f4
           ,in_stack_000000f2);
  return;
}

Assistant:

RemoteAcDetailTy::RemoteAcDetailTy (const Aircraft& _ac,
                                    double _lat, double _lon, float _alt_ft,
                                    std::uint16_t _dTime)
{
    // set everything to zero
    memset(this, 0, sizeof(*this));
    lat = lon = 0.0;
    alt_ft = 0.0f;
    // then copy from a/c
    CopyFrom(_ac, _lat, _lon, _alt_ft, _dTime);
}